

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferBufferParameters.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TextureBufferBufferParameters::iterate(TextureBufferBufferParameters *this)

{
  bool bVar1;
  GLboolean GVar2;
  GLboolean GVar3;
  GLboolean GVar4;
  int iVar5;
  deUint32 dVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  GLubyte *pGVar9;
  bool local_3e;
  bool local_3c;
  bool local_3a;
  bool local_38;
  bool local_36;
  bool local_34;
  bool local_32;
  bool local_30;
  bool local_2e;
  bool local_2c;
  bool local_2a;
  GLboolean test_passed;
  Functions *gl;
  TextureBufferBufferParameters *this_local;
  long lVar8;
  
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar5 = (*pRVar7->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  initTest(this);
  GVar2 = queryBufferParameteriv
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x8764,0);
  GVar3 = queryBufferParameteri64v
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x8764,0);
  (**(code **)(lVar8 + 0x150))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x100,0,0x88e5);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Could not initialize buffer object\'s data store!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferBufferParameters.cpp"
                  ,0xdb);
  GVar4 = queryBufferParameteriv
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x8764,0x100);
  local_2a = GVar4 != '\0' && (GVar3 != '\0' && GVar2 != '\0');
  GVar2 = queryBufferParameteri64v
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x8764,0x100);
  local_2c = false;
  if (GVar2 != '\0') {
    local_2c = local_2a;
  }
  GVar2 = queryBufferParameteriv
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x8765,0x88e5);
  local_2c = GVar2 != '\0' && local_2c;
  GVar2 = queryBufferParameteriv
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x88bc,0);
  local_2e = false;
  if (GVar2 != '\0') {
    local_2e = local_2c;
  }
  GVar2 = queryBufferParameteriv
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x9121,0);
  local_2e = GVar2 != '\0' && local_2e;
  GVar2 = queryBufferParameteri64v
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x9121,0);
  local_30 = false;
  if (GVar2 != '\0') {
    local_30 = local_2e;
  }
  GVar2 = queryBufferParameteriv
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x9120,0);
  local_30 = GVar2 != '\0' && local_30;
  GVar2 = queryBufferParameteri64v
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x9120,0);
  local_32 = false;
  if (GVar2 != '\0') {
    local_32 = local_30;
  }
  GVar2 = queryBufferPointerv(this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x88bd,
                              (GLvoid *)0x0);
  local_32 = GVar2 != '\0' && local_32;
  pGVar9 = (GLubyte *)
           (**(code **)(lVar8 + 0xd00))
                     ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0,0x100,1);
  this->m_buffer_pointer = pGVar9;
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Could not map buffer object\'s data store to client\'s address space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferBufferParameters.cpp"
                  ,0xfa);
  GVar2 = queryBufferParameteriv
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x88bc,1);
  local_34 = false;
  if (GVar2 != '\0') {
    local_34 = local_32;
  }
  GVar2 = queryBufferParameteriv
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x9121,0);
  local_34 = GVar2 != '\0' && local_34;
  GVar2 = queryBufferParameteri64v
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x9121,0);
  local_36 = false;
  if (GVar2 != '\0') {
    local_36 = local_34;
  }
  GVar2 = queryBufferParameteriv
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x9120,0x100);
  local_36 = GVar2 != '\0' && local_36;
  GVar2 = queryBufferParameteri64v
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x9120,0x100);
  local_38 = false;
  if (GVar2 != '\0') {
    local_38 = local_36;
  }
  GVar2 = queryBufferParameteriv
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x911f,1);
  local_38 = GVar2 != '\0' && local_38;
  GVar2 = queryBufferPointerv(this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x88bd,
                              this->m_buffer_pointer);
  local_3a = false;
  if (GVar2 != '\0') {
    local_3a = local_38;
  }
  this->m_buffer_pointer = (GLubyte *)0x0;
  (**(code **)(lVar8 + 0x1670))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Unmapping buffer failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferBufferParameters.cpp"
                  ,0x116);
  pGVar9 = (GLubyte *)
           (**(code **)(lVar8 + 0xd00))
                     ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x80,0x80,2);
  this->m_buffer_pointer = pGVar9;
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Could not map buffer object\'s data store to client\'s address space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferBufferParameters.cpp"
                  ,0x11b);
  GVar2 = queryBufferParameteriv
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x88bc,1);
  local_3a = GVar2 != '\0' && local_3a;
  GVar2 = queryBufferParameteriv
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x9121,0x80);
  local_3c = false;
  if (GVar2 != '\0') {
    local_3c = local_3a;
  }
  GVar2 = queryBufferParameteri64v
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x9121,0x80);
  local_3c = GVar2 != '\0' && local_3c;
  GVar2 = queryBufferParameteriv
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x9120,0x80);
  local_3e = false;
  if (GVar2 != '\0') {
    local_3e = local_3c;
  }
  GVar2 = queryBufferParameteri64v
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x9120,0x80);
  local_3e = GVar2 != '\0' && local_3e;
  GVar2 = queryBufferParameteriv
                    (this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x911f,2);
  bVar1 = false;
  if (GVar2 != '\0') {
    bVar1 = local_3e;
  }
  GVar2 = queryBufferPointerv(this,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0x88bd,
                              this->m_buffer_pointer);
  this->m_buffer_pointer = (GLubyte *)0x0;
  (**(code **)(lVar8 + 0x1670))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"Unmapping buffer failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferBufferParameters.cpp"
                  ,0x138);
  if (GVar2 == '\0' || !bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureBufferBufferParameters::iterate(void)
{
	/* Retrieve GLES entry points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initialization */
	initTest();

	glw::GLboolean test_passed = true;

	/* Query GL_BUFFER_SIZE without buffer object's data store initialized */
	test_passed =
		queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_SIZE, 0 /* expected size */) && test_passed;
	test_passed =
		queryBufferParameteri64v(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_SIZE, 0 /* expected size */) && test_passed;

	gl.bufferData(m_glExtTokens.TEXTURE_BUFFER, m_bo_size, DE_NULL, GL_STATIC_READ);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not initialize buffer object's data store!");

	/* Query GL_BUFFER_SIZE with buffer object's data store initialized */
	test_passed = queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_SIZE, m_bo_size /* expected size */) &&
				  test_passed;
	test_passed = queryBufferParameteri64v(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_SIZE,
										   (glw::GLint64)m_bo_size /* expected size */) &&
				  test_passed;

	/* Query GL_BUFFER_USAGE */
	test_passed = queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_USAGE, GL_STATIC_READ) && test_passed;

	/* Query GL_BUFFER_MAP... pnames without buffer object's data store being mapped */
	test_passed = queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAPPED, GL_FALSE) && test_passed;

	test_passed = queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_OFFSET, 0 /* expected offset */) &&
				  test_passed;
	test_passed =
		queryBufferParameteri64v(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_OFFSET, 0 /* expected offset */) &&
		test_passed;

	test_passed = queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_LENGTH, 0 /* expected size */) &&
				  test_passed;
	test_passed = queryBufferParameteri64v(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_LENGTH, 0 /* expected size */) &&
				  test_passed;

	test_passed =
		queryBufferPointerv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_POINTER, (glw::GLvoid*)DE_NULL) && test_passed;

	/* Mapping whole buffer object's data store */
	m_buffer_pointer = (glw::GLubyte*)gl.mapBufferRange(m_glExtTokens.TEXTURE_BUFFER, 0, m_bo_size, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not map buffer object's data store to client's address space!");

	/* Query GL_BUFFER_MAP... pnames with buffer object's data store being mapped */
	test_passed = queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAPPED, GL_TRUE) && test_passed;

	test_passed = queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_OFFSET, 0 /* expected offset */) &&
				  test_passed;
	test_passed =
		queryBufferParameteri64v(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_OFFSET, 0 /* expected offset */) &&
		test_passed;

	test_passed =
		queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_LENGTH, m_bo_size /* expected size */) &&
		test_passed;
	test_passed = queryBufferParameteri64v(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_LENGTH,
										   (glw::GLint64)m_bo_size /* expected size */) &&
				  test_passed;

	test_passed =
		queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_ACCESS_FLAGS, GL_MAP_READ_BIT) && test_passed;

	test_passed =
		queryBufferPointerv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_POINTER, (glw::GLvoid*)m_buffer_pointer) &&
		test_passed;

	/* Unmapping buffer object's data store */
	m_buffer_pointer = DE_NULL;
	gl.unmapBuffer(m_glExtTokens.TEXTURE_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Unmapping buffer failed");

	/* Mapping part of buffer object's data store */
	m_buffer_pointer = (glw::GLubyte*)gl.mapBufferRange(m_glExtTokens.TEXTURE_BUFFER, m_bo_size / 2 /* offset */,
														m_bo_size / 2 /* size */, GL_MAP_WRITE_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not map buffer object's data store to client's address space!");

	/* Query GL_BUFFER_MAP... pnames with buffer object's data store being mapped */
	test_passed = queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAPPED, GL_TRUE) && test_passed;

	test_passed = queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_OFFSET,
										 (m_bo_size / 2) /* expected offset */) &&
				  test_passed;
	test_passed = queryBufferParameteri64v(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_OFFSET,
										   (glw::GLint64)(m_bo_size / 2) /* expected offset */) &&
				  test_passed;

	test_passed = queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_LENGTH,
										 (m_bo_size / 2) /* expected size */) &&
				  test_passed;
	test_passed = queryBufferParameteri64v(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_LENGTH,
										   (glw::GLint64)(m_bo_size / 2) /* expected size */) &&
				  test_passed;

	test_passed =
		queryBufferParameteriv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_ACCESS_FLAGS, GL_MAP_WRITE_BIT) && test_passed;

	test_passed =
		queryBufferPointerv(m_glExtTokens.TEXTURE_BUFFER, GL_BUFFER_MAP_POINTER, (glw::GLvoid*)m_buffer_pointer) &&
		test_passed;

	/* Unmapping buffer object's data store */
	m_buffer_pointer = DE_NULL;
	gl.unmapBuffer(m_glExtTokens.TEXTURE_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Unmapping buffer failed");

	if (test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}